

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion * AML::operator+(Quaternion *__return_storage_ptr__,Quaternion *lhs,double s)

{
  double dVar1;
  
  dVar1 = (lhs->field_0).data[1];
  (__return_storage_ptr__->field_0).data[0] = (lhs->field_0).data[0] + s;
  (__return_storage_ptr__->field_0).data[1] = dVar1 + s;
  dVar1 = (lhs->field_0).data[3];
  (__return_storage_ptr__->field_0).data[2] = (lhs->field_0).data[2] + s;
  (__return_storage_ptr__->field_0).data[3] = dVar1 + s;
  return __return_storage_ptr__;
}

Assistant:

Quaternion operator+(const Quaternion& lhs, double s) { return (Quaternion(lhs) += s); }